

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O0

intmatrix sptk::swipe::onesim(int xSz,int ySz)

{
  intmatrix iVar1;
  int j;
  int i;
  intmatrix nw_matrix;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  int in_stack_ffffffffffffffe4;
  int iVar3;
  int local_10;
  int iStack_c;
  int **local_8;
  
  iVar1 = makeim(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
  for (iVar3 = 0; local_10 = iVar1.x, iVar3 < local_10; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iStack_c = iVar1.y, iVar2 < iStack_c; iVar2 = iVar2 + 1) {
      local_8 = iVar1.m;
      local_8[iVar3][iVar2] = 1;
    }
  }
  return iVar1;
}

Assistant:

intmatrix onesim(int xSz, int ySz) {
    int i, j;
    intmatrix nw_matrix = makeim(xSz, ySz);
    for (i = 0; i < nw_matrix.x; i++)
        for (j = 0; j < nw_matrix.y; j++)
            nw_matrix.m[i][j] = 1;
    return(nw_matrix);
}